

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::addTimingEvent
          (CLIntercept *this,char *functionName,uint64_t enqueueCounter,time_point queuedTime,
          string *tag,cl_command_queue queue,cl_event event)

{
  cl_icd_dispatch *pcVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  rep in_RCX;
  uint64_t in_RDX;
  map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
  *in_RSI;
  CLIntercept *in_RDI;
  string *in_R8;
  cl_command_queue in_R9;
  float __x;
  cl_event in_stack_00000008;
  int64_t interceptHostTimeDeltaNS;
  uint64_t interceptTimeEndNS;
  cl_ulong hostTimeNS;
  uint64_t interceptTimeStartNS;
  SDeviceInfo *deviceInfo;
  cl_device_id in_stack_000000e8;
  CLIntercept *in_stack_000000f0;
  cl_device_id device;
  SEventListNode *node;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffea8;
  list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
  *in_stack_fffffffffffffeb0;
  key_type *in_stack_fffffffffffffee8;
  map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
  *in_stack_fffffffffffffef0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d8;
  rep local_d0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c8;
  rep local_c0;
  cl_ulong local_b8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b0;
  rep local_a8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a0;
  rep local_98;
  bool local_89;
  mapped_type *local_88;
  byte local_7a;
  allocator local_79;
  string local_78 [32];
  cl_device_id local_58;
  reference local_50;
  undefined4 local_48;
  cl_command_queue local_30;
  string *local_28;
  uint64_t local_20;
  map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
  *local_18;
  rep local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_8 = in_RCX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (in_stack_00000008 == (cl_event)0x0) {
    logf(in_RDI,__x);
    local_48 = 1;
  }
  else {
    std::__cxx11::list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::
    emplace_back<>(in_stack_fffffffffffffeb0);
    local_50 = std::__cxx11::
               list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::back
                         (in_stack_fffffffffffffeb0);
    local_58 = (cl_device_id)0x0;
    pcVar1 = dispatch(in_RDI);
    (*pcVar1->clGetCommandQueueInfo)(local_30,0x1091,8,&local_58,(size_t *)0x0);
    cacheDeviceInfo(in_stack_000000f0,in_stack_000000e8);
    pcVar1 = dispatch(in_RDI);
    (*pcVar1->clRetainEvent)(in_stack_00000008);
    local_50->Device = local_58;
    pmVar2 = std::
             map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
             ::operator[](in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
    local_50->QueueNumber = *pmVar2;
    uVar3 = std::__cxx11::string::empty();
    local_7a = 0;
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string(local_78,local_28);
    }
    else {
      std::allocator<char>::allocator();
      local_7a = 1;
      std::__cxx11::string::string(local_78,(char *)local_18,&local_79);
      in_stack_fffffffffffffef0 = local_18;
    }
    std::__cxx11::string::operator=((string *)&local_50->Name,local_78);
    std::__cxx11::string::~string(local_78);
    if ((local_7a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    local_50->EnqueueCounter = local_20;
    (local_50->QueuedTime).__d.__r = local_8;
    local_50->UseProfilingDelta = false;
    local_50->ProfilingDeltaNS = 0;
    local_50->Event = in_stack_00000008;
    if ((local_58 != (cl_device_id)0x0) &&
       (local_88 = std::
                   map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                   ::operator[]((map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                                 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8),
       (local_88->HasDeviceAndHostTimer & 1U) != 0)) {
      local_89 = 0x800fff < local_88->NumericVersion;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_89);
      pcVar1 = dispatch(in_RDI);
      std::_Swallow_assign::operator=
                ((_Swallow_assign *)&std::ignore,
                 (_func_int__cl_device_id_ptr_unsigned_long_ptr **)&pcVar1->clGetHostTimer);
      local_b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_a8 = (rep)std::chrono::
                      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_b0);
      local_a0.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                     in_stack_fffffffffffffea8);
      local_98 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_a0);
      local_b8 = 0;
      pcVar1 = dispatch(in_RDI);
      (*pcVar1->clGetHostTimer)(local_58,&local_b8);
      local_d8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_d0 = (rep)std::chrono::
                      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_d8);
      local_c8.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                     in_stack_fffffffffffffea8);
      local_c0 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_c8);
      local_50->UseProfilingDelta = true;
      local_50->ProfilingDeltaNS =
           (((ulong)(local_c0 - local_98) >> 1) + (local_98 - local_b8)) -
           local_88->DeviceHostTimeDeltaNS;
    }
    local_48 = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x207256);
  return;
}

Assistant:

void CLIntercept::addTimingEvent(
    const char* functionName,
    const uint64_t enqueueCounter,
    const clock::time_point queuedTime,
    const std::string& tag,
    const cl_command_queue queue,
    cl_event event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( event == NULL )
    {
        logf( "Unexpectedly got a NULL timing event for %s, check for OpenCL errors!\n",
            functionName );
        return;
    }

    m_EventList.emplace_back();

    SEventListNode& node = m_EventList.back();

    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );

    // Cache the device info if it's not cached already, since we'll print
    // the device name and other device properties as part of the report.
    cacheDeviceInfo( device );

    dispatch().clRetainEvent( event );

    node.Device = device;
    node.QueueNumber = m_QueueNumberMap[ queue ];
    node.Name = !tag.empty() ? tag : functionName;
    node.EnqueueCounter = enqueueCounter;
    node.QueuedTime = queuedTime;
    node.UseProfilingDelta = false;
    node.ProfilingDeltaNS = 0;
    node.Event = event;

    if( device )
    {
        const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

        // Note: Even though ideally the intercept timer and the host timer should advance
        // at a consistent rate and hence the delta between the two timers should remain
        // constant, empirically this does not appear to be the case.  Synchronizing the
        // two timers is relatively inexpensive, and reduces the timer drift, so compute
        // the current delta for each event.

        if( deviceInfo.HasDeviceAndHostTimer )
        {
            // These conditions should have been checked for HasDeviceAndHostTimer to be true:
            CLI_ASSERT( deviceInfo.NumericVersion >= CL_MAKE_VERSION_KHR(2, 1, 0) );
            CLI_ASSERT( dispatch().clGetHostTimer );

            using ns = std::chrono::nanoseconds;
            const uint64_t  interceptTimeStartNS =
                std::chrono::duration_cast<ns>(clock::now().time_since_epoch()).count();

            cl_ulong    hostTimeNS = 0;
            dispatch().clGetHostTimer(
                device,
                &hostTimeNS);

            const uint64_t  interceptTimeEndNS =
                std::chrono::duration_cast<ns>(clock::now().time_since_epoch()).count();

            const int64_t   interceptHostTimeDeltaNS =
                ( interceptTimeEndNS - interceptTimeStartNS ) / 2 +
                ( interceptTimeStartNS - hostTimeNS );

            node.UseProfilingDelta = true;
            node.ProfilingDeltaNS =
                interceptHostTimeDeltaNS -
                deviceInfo.DeviceHostTimeDeltaNS;

            //logf( "Current Profiling Delta is %lld ns (%.2f us, %.2f ms)\n"
            //    "\tIntercept to Host Timer delta: %lld ns (%.2f us, %.2f ms)\n"
            //    "\tIntercept Start %llu ns, Intercept End %llu ns (delta %lld ns)\n"
            //    "\tHost %llu ns\n",
            //    node.ProfilingDeltaNS, node.ProfilingDeltaNS / 1000.0, node.ProfilingDeltaNS / 1000000.0,
            //    interceptHostTimeDeltaNS, interceptHostTimeDeltaNS / 1000.0, interceptHostTimeDeltaNS / 1000000.0,
            //    interceptTimeStartNS, interceptTimeEndNS, interceptTimeEndNS - interceptTimeStartNS,
            //    hostTimeNS );
        }
    }
}